

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gmock-spec-builders.h
# Opt level: O1

bool __thiscall
testing::internal::
TypedExpectation<ot::commissioner::Error_(ot::commissioner::CommissionerDataset_&,_unsigned_short)>
::Matches(TypedExpectation<ot::commissioner::Error_(ot::commissioner::CommissionerDataset_&,_unsigned_short)>
          *this,ArgumentTuple *args)

{
  bool bVar1;
  undefined1 uVar2;
  DummyMatchResultListener dummy;
  
  MutexBase::AssertHeld((MutexBase *)g_gmock_mutex);
  bVar1 = TuplePrefix<2ul>::
          Matches<std::tuple<testing::Matcher<ot::commissioner::CommissionerDataset&>,testing::Matcher<unsigned_short>>,std::tuple<ot::commissioner::CommissionerDataset&,unsigned_short>>
                    ((tuple<testing::Matcher<ot::commissioner::CommissionerDataset_&>,_testing::Matcher<unsigned_short>_>
                      *)(this + 0xf0),args);
  if (bVar1) {
    uVar2 = (**(code **)(**(long **)(this + 0x128) + 0x20))(*(long **)(this + 0x128),args);
  }
  else {
    uVar2 = 0;
  }
  return (bool)uVar2;
}

Assistant:

GTEST_EXCLUSIVE_LOCK_REQUIRED_(g_gmock_mutex) {
    g_gmock_mutex.AssertHeld();
    return TupleMatches(matchers_, args) && extra_matcher_.Matches(args);
  }